

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::ConflictPoolPropagation::propagateConflict
          (ConflictPoolPropagation *this,HighsInt conflict)

{
  int iVar1;
  uint uVar2;
  HighsBoundType HVar3;
  bool bVar4;
  int iVar5;
  byte *pbVar6;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *this_00;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar7;
  const_reference pvVar8;
  WatchedLiteral *pWVar9;
  reference pvVar10;
  reference pvVar11;
  pointer pHVar12;
  Reason RVar13;
  size_type sVar14;
  const_reference pvVar15;
  int in_ESI;
  int *in_RDI;
  HighsDomainChange HVar16;
  HighsDomainChange domchg;
  HighsInt i;
  uint8_t numInactive;
  array<int,_2UL> inactive;
  WatchedLiteral *watched;
  HighsInt end;
  HighsInt start;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *entries;
  size_type in_stack_ffffffffffffff18;
  array<int,_2UL> *in_stack_ffffffffffffff20;
  HighsDomainChange *in_stack_ffffffffffffff28;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *pvVar17;
  HighsDomain *in_stack_ffffffffffffff30;
  WatchedLiteral *pWVar18;
  HighsDomainChange *in_stack_ffffffffffffff38;
  HighsDomain *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  HighsInt HVar19;
  ConflictPoolPropagation *in_stack_ffffffffffffff50;
  HighsDomain *this_01;
  Reason in_stack_ffffffffffffffc0;
  value_type_conflict2 vVar20;
  uint in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  
  HVar19 = (HighsInt)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x12),
                      (long)in_ESI);
  *pbVar6 = *pbVar6 & 0xb;
  pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x12),
                      (long)in_ESI);
  if ((*pbVar6 < 2) && ((*(byte *)(*(long *)(in_RDI + 2) + 0x280) & 1) == 0)) {
    this_00 = HighsConflictPool::getConflictEntryVector(*(HighsConflictPool **)(in_RDI + 4));
    pvVar7 = HighsConflictPool::getConflictRanges(*(HighsConflictPool **)(in_RDI + 4));
    pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       (pvVar7,(long)in_ESI);
    iVar5 = pvVar8->first;
    if (iVar5 == -1) {
      unlinkWatchedLiteral(in_stack_ffffffffffffff50,HVar19);
      unlinkWatchedLiteral(in_stack_ffffffffffffff50,HVar19);
    }
    else {
      pvVar7 = HighsConflictPool::getConflictRanges(*(HighsConflictPool **)(in_RDI + 4));
      pvVar8 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                         (pvVar7,(long)in_ESI);
      iVar1 = pvVar8->second;
      pWVar9 = std::
               vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
               ::data((vector<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
                       *)0x5bc2b4);
      pWVar9 = pWVar9 + (in_ESI << 1);
      in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc & 0xffffff;
      while (vVar20 = iVar5, iVar5 != iVar1) {
        std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                  (this_00,(long)iVar5);
        bVar4 = isActive(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        vVar20 = iVar5;
        if (!bVar4) {
          in_stack_ffffffffffffffcc =
               CONCAT13((char)(in_stack_ffffffffffffffcc >> 0x18) + '\x01',
                        (int3)in_stack_ffffffffffffffcc);
          pvVar10 = std::array<int,_2UL>::operator[]
                              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          *pvVar10 = iVar5;
          if ((char)(in_stack_ffffffffffffffcc >> 0x18) == '\x02') break;
        }
        iVar5 = vVar20 + 1;
      }
      uVar2 = in_stack_ffffffffffffffcc >> 0x18;
      pvVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x12),
                           (long)in_ESI);
      *pvVar11 = (value_type)uVar2;
      uVar2 = in_stack_ffffffffffffffcc >> 0x18;
      if (uVar2 == 0) {
        pHVar12 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                  operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                              *)0x5bc404);
        HVar19 = (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20);
        HighsDebugSol::nodePruned
                  ((HighsDebugSol *)&pHVar12->field_0x68b0,*(HighsDomain **)(in_RDI + 2));
        *(undefined1 *)(*(long *)(in_RDI + 2) + 0x280) = 1;
        sVar14 = std::
                 deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                 ::size((deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                         *)0x5bc43c);
        RVar13 = Reason::cut((int)sVar14 + *in_RDI,in_ESI);
        *(Reason *)(*(long *)(in_RDI + 2) + 0x284) = RVar13;
        sVar14 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                           ((vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *)
                            (*(long *)(in_RDI + 2) + 0x48));
        *(int *)(*(long *)(in_RDI + 2) + 0x28c) = (int)sVar14;
        HighsConflictPool::resetAge((HighsConflictPool *)in_stack_ffffffffffffff30,HVar19);
      }
      else if (uVar2 == 1) {
        pvVar10 = std::array<int,_2UL>::operator[]
                            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                  (this_00,(long)*pvVar10);
        HVar16 = flip(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        this_01 = HVar16._8_8_;
        bVar4 = isActive(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        if (!bVar4) {
          pvVar10 = std::array<int,_2UL>::operator[]
                              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                    (this_00,(long)*pvVar10);
          flip(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
          HVar19 = (HighsInt)((ulong)in_stack_ffffffffffffff28 >> 0x20);
          sVar14 = std::
                   deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                   ::size((deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
                           *)0x5bc59e);
          Reason::cut((int)sVar14 + *in_RDI,in_ESI);
          HVar16.boundval._4_4_ = in_stack_ffffffffffffffcc;
          HVar16.boundval._0_4_ = vVar20;
          HVar16.column = (int)in_stack_ffffffffffffffd0;
          HVar16.boundtype = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
          changeBound(this_01,HVar16,in_stack_ffffffffffffffc0);
          HighsConflictPool::resetAge((HighsConflictPool *)in_stack_ffffffffffffff30,HVar19);
        }
      }
      else if (uVar2 == 2) {
        pvVar17 = this_00;
        pWVar18 = pWVar9;
        pvVar10 = std::array<int,_2UL>::operator[]
                            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        pvVar15 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                            (pvVar17,(long)*pvVar10);
        bVar4 = HighsDomainChange::operator!=(&pWVar18->domchg,pvVar15);
        HVar19 = (HighsInt)((ulong)pWVar18 >> 0x20);
        if (bVar4) {
          unlinkWatchedLiteral(in_stack_ffffffffffffff50,HVar19);
          pvVar17 = this_00;
          pvVar10 = std::array<int,_2UL>::operator[]
                              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          pvVar15 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                              (pvVar17,(long)*pvVar10);
          (pWVar9->domchg).boundval = pvVar15->boundval;
          HVar3 = pvVar15->boundtype;
          (pWVar9->domchg).column = pvVar15->column;
          (pWVar9->domchg).boundtype = HVar3;
          linkWatchedLiteral(in_stack_ffffffffffffff50,HVar19);
        }
        pWVar18 = pWVar9 + 1;
        pvVar17 = this_00;
        pvVar10 = std::array<int,_2UL>::operator[]
                            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
        pvVar15 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                            (pvVar17,(long)*pvVar10);
        bVar4 = HighsDomainChange::operator!=(&pWVar18->domchg,pvVar15);
        if (bVar4) {
          unlinkWatchedLiteral(in_stack_ffffffffffffff50,HVar19);
          pvVar10 = std::array<int,_2UL>::operator[]
                              ((array<int,_2UL> *)this_00,in_stack_ffffffffffffff18);
          pvVar15 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::operator[]
                              (this_00,(long)*pvVar10);
          pWVar9[1].domchg.boundval = pvVar15->boundval;
          HVar3 = pvVar15->boundtype;
          pWVar9[1].domchg.column = pvVar15->column;
          pWVar9[1].domchg.boundtype = HVar3;
          linkWatchedLiteral(in_stack_ffffffffffffff50,HVar19);
        }
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::propagateConflict(
    HighsInt conflict) {
  // remove propagate flag, but keep watched and deleted information
  conflictFlag_[conflict] &= (3 | 8);
  // if two inactive literals are watched or conflict has been deleted skip
  if (conflictFlag_[conflict] >= 2) return;

  if (domain->infeasible_) return;

  const std::vector<HighsDomainChange>& entries =
      conflictpool_->getConflictEntryVector();
  HighsInt start = conflictpool_->getConflictRanges()[conflict].first;
  if (start == -1) {
    unlinkWatchedLiteral(2 * conflict);
    unlinkWatchedLiteral(2 * conflict + 1);
    return;
  }
  HighsInt end = conflictpool_->getConflictRanges()[conflict].second;

  WatchedLiteral* watched = watchedLiterals_.data() + 2 * conflict;

  std::array<HighsInt, 2> inactive;
  uint8_t numInactive = 0;
  for (HighsInt i = start; i != end; ++i) {
    if (domain->isActive(entries[i])) continue;

    inactive[numInactive++] = i;
    if (numInactive == 2) break;
  }

  conflictFlag_[conflict] = numInactive;

  switch (numInactive) {
    case 0:
      assert(!domain->infeasible_);
      domain->mipsolver->mipdata_->debugSolution.nodePruned(*domain);
      domain->infeasible_ = true;
      domain->infeasible_reason = Reason::cut(
          domain->cutpoolpropagation.size() + conflictpoolindex, conflict);
      domain->infeasible_pos = domain->domchgstack_.size();
      conflictpool_->resetAge(conflict);
      // printf("conflict propagation found infeasibility\n");
      break;
    case 1: {
      HighsDomainChange domchg = domain->flip(entries[inactive[0]]);
      if (!domain->isActive(domchg)) {
        domain->changeBound(
            domain->flip(entries[inactive[0]]),
            Reason::cut(domain->cutpoolpropagation.size() + conflictpoolindex,
                        conflict));
        conflictpool_->resetAge(conflict);
      }
      // printf("conflict propagation found bound change\n");
      break;
    }
    case 2: {
      if (watched[0].domchg != entries[inactive[0]]) {
        unlinkWatchedLiteral(2 * conflict);
        watched[0].domchg = entries[inactive[0]];
        linkWatchedLiteral(2 * conflict);
      }

      if (watched[1].domchg != entries[inactive[1]]) {
        unlinkWatchedLiteral(2 * conflict + 1);
        watched[1].domchg = entries[inactive[1]];
        linkWatchedLiteral(2 * conflict + 1);
      }

      return;
    }
  }
}